

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::ConstFunction<int_(int,_int)>::Iface> * __thiscall
kj::Own<kj::ConstFunction<int_(int,_int)>::Iface>::operator=
          (Own<kj::ConstFunction<int_(int,_int)>::Iface> *this,
          Own<kj::ConstFunction<int_(int,_int)>::Iface> *other)

{
  Disposer *object;
  Dispose_<kj::ConstFunction<int_(int,_int)>::Iface,_true> *this_00;
  Iface *pIVar1;
  Disposer *in_RDX;
  
  object = this->disposer;
  this_00 = (Dispose_<kj::ConstFunction<int_(int,_int)>::Iface,_true> *)this->ptr;
  pIVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pIVar1;
  other->ptr = (Iface *)0x0;
  if (this_00 != (Dispose_<kj::ConstFunction<int_(int,_int)>::Iface,_true> *)0x0) {
    Disposer::Dispose_<kj::ConstFunction<int_(int,_int)>::Iface,_true>::dispose
              (this_00,(Iface *)object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }